

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_mpsadbw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t offset)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [14];
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [14];
  undefined1 auVar19 [15];
  undefined1 auVar20 [14];
  undefined1 auVar21 [15];
  undefined1 auVar22 [14];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [11];
  undefined1 auVar42 [13];
  undefined1 auVar43 [14];
  undefined1 auVar44 [15];
  undefined1 auVar45 [11];
  undefined1 auVar46 [14];
  undefined1 auVar47 [15];
  undefined1 auVar48 [11];
  undefined1 auVar49 [14];
  undefined1 auVar50 [15];
  undefined1 auVar51 [11];
  undefined1 auVar52 [14];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  uint6 uVar61;
  ulong uVar62;
  ulong uVar63;
  ushort uVar64;
  uint uVar65;
  uint uVar67;
  uint uVar68;
  undefined1 auVar66 [15];
  uint uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar75;
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  uint uVar78;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  undefined1 auVar79 [16];
  uint uVar85;
  undefined1 auVar80 [16];
  uint uVar86;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  undefined1 auVar87 [16];
  uint64_t local_30;
  uint64_t uStack_28;
  uint64_t local_20;
  uint64_t uStack_18;
  uint64_t local_10;
  uint64_t uStack_8;
  
  uVar62 = (ulong)(offset & 4);
  uVar63 = (ulong)(offset & 3);
  uVar90 = (uint)*(byte *)((long)s + uVar63 * 4);
  uVar84 = (uint)s->_b_ZMMReg[uVar63 * 4 + 1];
  uVar85 = (uint)s->_b_ZMMReg[uVar63 * 4 + 2];
  uVar75 = (uint)s->_b_ZMMReg[uVar63 * 4 + 3];
  uVar63 = *(ulong *)((long)d + uVar62 + 1);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar63;
  auVar73 = _DAT_00d60ae0 & auVar70 | ZEXT116(d->_b_ZMMReg[uVar62]) << 0x38;
  auVar77._0_8_ = auVar73._0_8_ >> 0x38;
  auVar77._8_8_ = auVar73._8_8_ >> 0x38;
  auVar66._8_7_ = 0;
  auVar66._0_8_ = uVar63 << 8;
  auVar66 = auVar66 | auVar77._0_15_;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar66._0_13_;
  auVar7[0xe] = auVar66[7];
  auVar12[0xc] = auVar66[6];
  auVar12._0_12_ = auVar66._0_12_;
  auVar12._13_2_ = auVar7._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar66._0_11_;
  auVar16._12_3_ = auVar12._12_3_;
  uVar78 = auVar16._11_4_;
  auVar23[10] = auVar66[5];
  auVar23._0_10_ = auVar66._0_10_;
  auVar23._11_4_ = uVar78;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar66._0_9_;
  auVar27._10_5_ = auVar23._10_5_;
  auVar31[8] = auVar66[4];
  auVar31._0_8_ = auVar66._0_8_;
  auVar31._9_6_ = auVar27._9_6_;
  auVar39._7_8_ = 0;
  auVar39._0_7_ = auVar31._8_7_;
  Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),auVar66[3]);
  auVar53._9_6_ = 0;
  auVar53._0_9_ = Var40;
  auVar41._1_10_ = SUB1510(auVar53 << 0x30,5);
  auVar41[0] = auVar66[2];
  auVar54._11_4_ = 0;
  auVar54._0_11_ = auVar41;
  auVar42._1_12_ = SUB1512(auVar54 << 0x20,3);
  auVar42[0] = auVar66[1];
  uVar64 = CONCAT11(0,auVar66[0]);
  auVar38._2_13_ = auVar42;
  auVar38._0_2_ = uVar64;
  auVar8._10_2_ = 0;
  auVar8._0_10_ = auVar38._0_10_;
  auVar8._12_2_ = (short)Var40;
  uVar61 = CONCAT42(auVar8._10_4_,auVar41._0_2_);
  auVar43._6_8_ = 0;
  auVar43._0_6_ = uVar61;
  uVar65 = uVar64 - uVar90;
  uVar67 = (int)CONCAT82(SUB148(auVar43 << 0x40,6),auVar42._0_2_) - uVar90;
  uVar68 = (int)uVar61 - uVar90;
  uVar69 = (auVar8._10_4_ >> 0x10) - uVar90;
  uVar86 = auVar31._8_2_ - uVar90;
  uVar88 = auVar23._10_2_ - uVar90;
  uVar89 = (uVar78 >> 8 & 0xffff) - uVar90;
  uVar90 = (uVar78 >> 0x18) - uVar90;
  uVar78 = (int)uVar86 >> 0x1f;
  uVar81 = (int)uVar88 >> 0x1f;
  uVar82 = (int)uVar89 >> 0x1f;
  uVar83 = (int)uVar90 >> 0x1f;
  auVar87._0_4_ = (uVar86 ^ uVar78) - uVar78;
  auVar87._4_4_ = (uVar88 ^ uVar81) - uVar81;
  auVar87._8_4_ = (uVar89 ^ uVar82) - uVar82;
  auVar87._12_4_ = (uVar90 ^ uVar83) - uVar83;
  uVar78 = (int)uVar65 >> 0x1f;
  uVar90 = (int)uVar67 >> 0x1f;
  uVar81 = (int)uVar68 >> 0x1f;
  uVar82 = (int)uVar69 >> 0x1f;
  auVar73._0_4_ = (uVar65 ^ uVar78) - uVar78;
  auVar73._4_4_ = (uVar67 ^ uVar90) - uVar90;
  auVar73._8_4_ = (uVar68 ^ uVar81) - uVar81;
  auVar73._12_4_ = (uVar69 ^ uVar82) - uVar82;
  auVar73 = packssdw(auVar73,auVar87);
  auVar1._8_6_ = 0;
  auVar1._0_8_ = uVar63;
  auVar1[0xe] = (char)(uVar63 >> 0x38);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar63;
  auVar9[0xc] = (char)(uVar63 >> 0x30);
  auVar9._13_2_ = auVar1._13_2_;
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar63;
  auVar13._12_3_ = auVar9._12_3_;
  uVar78 = auVar13._11_4_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = uVar63;
  auVar17[10] = (char)(uVar63 >> 0x28);
  auVar17._11_4_ = uVar78;
  auVar24._8_2_ = 0;
  auVar24._0_8_ = uVar63;
  auVar24._10_5_ = auVar17._10_5_;
  auVar28[8] = (char)(uVar63 >> 0x20);
  auVar28._0_8_ = uVar63;
  auVar28._9_6_ = auVar24._9_6_;
  auVar44._7_8_ = 0;
  auVar44._0_7_ = auVar28._8_7_;
  Var40 = CONCAT81(SUB158(auVar44 << 0x40,7),(char)(uVar63 >> 0x18));
  auVar55._9_6_ = 0;
  auVar55._0_9_ = Var40;
  auVar45._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar45[0] = (char)(uVar63 >> 0x10);
  auVar56._11_4_ = 0;
  auVar56._0_11_ = auVar45;
  auVar32[2] = (char)(uVar63 >> 8);
  auVar32._0_2_ = (ushort)uVar63;
  auVar32._3_12_ = SUB1512(auVar56 << 0x20,3);
  auVar35._2_13_ = auVar32._2_13_;
  auVar35._0_2_ = (ushort)uVar63 & 0xff;
  auVar2._10_2_ = 0;
  auVar2._0_10_ = auVar35._0_10_;
  auVar2._12_2_ = (short)Var40;
  uVar61 = CONCAT42(auVar2._10_4_,auVar45._0_2_);
  auVar46._6_8_ = 0;
  auVar46._0_6_ = uVar61;
  auVar18._4_2_ = auVar32._2_2_;
  auVar18._0_4_ = auVar35._0_4_;
  auVar18._6_8_ = SUB148(auVar46 << 0x40,6);
  uVar90 = (auVar35._0_4_ & 0xffff) - uVar84;
  uVar65 = auVar18._4_4_ - uVar84;
  uVar67 = (int)uVar61 - uVar84;
  uVar68 = (auVar2._10_4_ >> 0x10) - uVar84;
  uVar83 = auVar28._8_2_ - uVar84;
  uVar86 = auVar17._10_2_ - uVar84;
  uVar88 = (uVar78 >> 8 & 0xffff) - uVar84;
  uVar84 = (uVar78 >> 0x18) - uVar84;
  uVar78 = (int)uVar83 >> 0x1f;
  uVar69 = (int)uVar86 >> 0x1f;
  uVar81 = (int)uVar88 >> 0x1f;
  uVar82 = (int)uVar84 >> 0x1f;
  auVar79._0_4_ = (uVar83 ^ uVar78) - uVar78;
  auVar79._4_4_ = (uVar86 ^ uVar69) - uVar69;
  auVar79._8_4_ = (uVar88 ^ uVar81) - uVar81;
  auVar79._12_4_ = (uVar84 ^ uVar82) - uVar82;
  uVar78 = (int)uVar90 >> 0x1f;
  uVar84 = (int)uVar65 >> 0x1f;
  uVar69 = (int)uVar67 >> 0x1f;
  uVar81 = (int)uVar68 >> 0x1f;
  auVar72._0_4_ = (uVar90 ^ uVar78) - uVar78;
  auVar72._4_4_ = (uVar65 ^ uVar84) - uVar84;
  auVar72._8_4_ = (uVar67 ^ uVar69) - uVar69;
  auVar72._12_4_ = (uVar68 ^ uVar81) - uVar81;
  auVar70 = packssdw(auVar72,auVar79);
  uVar63 = *(ulong *)((long)d + uVar62 + 2);
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar63;
  auVar3[0xe] = (char)(uVar63 >> 0x38);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar63;
  auVar10[0xc] = (char)(uVar63 >> 0x30);
  auVar10._13_2_ = auVar3._13_2_;
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar63;
  auVar14._12_3_ = auVar10._12_3_;
  uVar78 = auVar14._11_4_;
  auVar19._8_2_ = 0;
  auVar19._0_8_ = uVar63;
  auVar19[10] = (char)(uVar63 >> 0x28);
  auVar19._11_4_ = uVar78;
  auVar25._8_2_ = 0;
  auVar25._0_8_ = uVar63;
  auVar25._10_5_ = auVar19._10_5_;
  auVar29[8] = (char)(uVar63 >> 0x20);
  auVar29._0_8_ = uVar63;
  auVar29._9_6_ = auVar25._9_6_;
  auVar47._7_8_ = 0;
  auVar47._0_7_ = auVar29._8_7_;
  Var40 = CONCAT81(SUB158(auVar47 << 0x40,7),(char)(uVar63 >> 0x18));
  auVar57._9_6_ = 0;
  auVar57._0_9_ = Var40;
  auVar48._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar48[0] = (char)(uVar63 >> 0x10);
  auVar58._11_4_ = 0;
  auVar58._0_11_ = auVar48;
  auVar33[2] = (char)(uVar63 >> 8);
  auVar33._0_2_ = (ushort)uVar63;
  auVar33._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar36._2_13_ = auVar33._2_13_;
  auVar36._0_2_ = (ushort)uVar63 & 0xff;
  auVar4._10_2_ = 0;
  auVar4._0_10_ = auVar36._0_10_;
  auVar4._12_2_ = (short)Var40;
  uVar61 = CONCAT42(auVar4._10_4_,auVar48._0_2_);
  auVar49._6_8_ = 0;
  auVar49._0_6_ = uVar61;
  auVar20._4_2_ = auVar33._2_2_;
  auVar20._0_4_ = auVar36._0_4_;
  auVar20._6_8_ = SUB148(auVar49 << 0x40,6);
  uVar67 = (auVar36._0_4_ & 0xffff) - uVar85;
  uVar68 = auVar20._4_4_ - uVar85;
  uVar69 = (int)uVar61 - uVar85;
  uVar81 = (auVar4._10_4_ >> 0x10) - uVar85;
  uVar82 = auVar29._8_2_ - uVar85;
  uVar83 = auVar19._10_2_ - uVar85;
  uVar86 = (uVar78 >> 8 & 0xffff) - uVar85;
  uVar85 = (uVar78 >> 0x18) - uVar85;
  uVar78 = (int)uVar82 >> 0x1f;
  uVar90 = (int)uVar83 >> 0x1f;
  uVar84 = (int)uVar86 >> 0x1f;
  uVar65 = (int)uVar85 >> 0x1f;
  auVar80._0_4_ = (uVar82 ^ uVar78) - uVar78;
  auVar80._4_4_ = (uVar83 ^ uVar90) - uVar90;
  auVar80._8_4_ = (uVar86 ^ uVar84) - uVar84;
  auVar80._12_4_ = (uVar85 ^ uVar65) - uVar65;
  uVar78 = (int)uVar67 >> 0x1f;
  uVar90 = (int)uVar68 >> 0x1f;
  uVar85 = (int)uVar69 >> 0x1f;
  uVar84 = (int)uVar81 >> 0x1f;
  auVar76._0_4_ = (uVar67 ^ uVar78) - uVar78;
  auVar76._4_4_ = (uVar68 ^ uVar90) - uVar90;
  auVar76._8_4_ = (uVar69 ^ uVar85) - uVar85;
  auVar76._12_4_ = (uVar81 ^ uVar84) - uVar84;
  auVar77 = packssdw(auVar76,auVar80);
  uVar63 = *(ulong *)((long)d + uVar62 + 3);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar63;
  auVar5[0xe] = (char)(uVar63 >> 0x38);
  auVar11._8_4_ = 0;
  auVar11._0_8_ = uVar63;
  auVar11[0xc] = (char)(uVar63 >> 0x30);
  auVar11._13_2_ = auVar5._13_2_;
  auVar15._8_4_ = 0;
  auVar15._0_8_ = uVar63;
  auVar15._12_3_ = auVar11._12_3_;
  uVar78 = auVar15._11_4_;
  auVar21._8_2_ = 0;
  auVar21._0_8_ = uVar63;
  auVar21[10] = (char)(uVar63 >> 0x28);
  auVar21._11_4_ = uVar78;
  auVar26._8_2_ = 0;
  auVar26._0_8_ = uVar63;
  auVar26._10_5_ = auVar21._10_5_;
  auVar30[8] = (char)(uVar63 >> 0x20);
  auVar30._0_8_ = uVar63;
  auVar30._9_6_ = auVar26._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar30._8_7_;
  Var40 = CONCAT81(SUB158(auVar50 << 0x40,7),(char)(uVar63 >> 0x18));
  auVar59._9_6_ = 0;
  auVar59._0_9_ = Var40;
  auVar51._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar51[0] = (char)(uVar63 >> 0x10);
  auVar60._11_4_ = 0;
  auVar60._0_11_ = auVar51;
  auVar34[2] = (char)(uVar63 >> 8);
  auVar34._0_2_ = (ushort)uVar63;
  auVar34._3_12_ = SUB1512(auVar60 << 0x20,3);
  auVar37._2_13_ = auVar34._2_13_;
  auVar37._0_2_ = (ushort)uVar63 & 0xff;
  auVar6._10_2_ = 0;
  auVar6._0_10_ = auVar37._0_10_;
  auVar6._12_2_ = (short)Var40;
  uVar61 = CONCAT42(auVar6._10_4_,auVar51._0_2_);
  auVar52._6_8_ = 0;
  auVar52._0_6_ = uVar61;
  auVar22._4_2_ = auVar34._2_2_;
  auVar22._0_4_ = auVar37._0_4_;
  auVar22._6_8_ = SUB148(auVar52 << 0x40,6);
  uVar65 = (auVar37._0_4_ & 0xffff) - uVar75;
  uVar67 = auVar22._4_4_ - uVar75;
  uVar68 = (int)uVar61 - uVar75;
  uVar69 = (auVar6._10_4_ >> 0x10) - uVar75;
  uVar81 = auVar30._8_2_ - uVar75;
  uVar82 = auVar21._10_2_ - uVar75;
  uVar83 = (uVar78 >> 8 & 0xffff) - uVar75;
  uVar75 = (uVar78 >> 0x18) - uVar75;
  uVar78 = (int)uVar81 >> 0x1f;
  uVar90 = (int)uVar82 >> 0x1f;
  uVar85 = (int)uVar83 >> 0x1f;
  uVar84 = (int)uVar75 >> 0x1f;
  auVar74._0_4_ = (uVar81 ^ uVar78) - uVar78;
  auVar74._4_4_ = (uVar82 ^ uVar90) - uVar90;
  auVar74._8_4_ = (uVar83 ^ uVar85) - uVar85;
  auVar74._12_4_ = (uVar75 ^ uVar84) - uVar84;
  uVar78 = (int)uVar65 >> 0x1f;
  uVar90 = (int)uVar67 >> 0x1f;
  uVar75 = (int)uVar68 >> 0x1f;
  uVar85 = (int)uVar69 >> 0x1f;
  auVar71._0_4_ = (uVar65 ^ uVar78) - uVar78;
  auVar71._4_4_ = (uVar67 ^ uVar90) - uVar90;
  auVar71._8_4_ = (uVar68 ^ uVar75) - uVar75;
  auVar71._12_4_ = (uVar69 ^ uVar85) - uVar85;
  auVar72 = packssdw(auVar71,auVar74);
  d->_w_ZMMReg[0] = auVar72._0_2_ + auVar77._0_2_ + auVar70._0_2_ + auVar73._0_2_;
  d->_w_ZMMReg[1] = auVar72._2_2_ + auVar77._2_2_ + auVar70._2_2_ + auVar73._2_2_;
  d->_w_ZMMReg[2] = auVar72._4_2_ + auVar77._4_2_ + auVar70._4_2_ + auVar73._4_2_;
  d->_w_ZMMReg[3] = auVar72._6_2_ + auVar77._6_2_ + auVar70._6_2_ + auVar73._6_2_;
  d->_w_ZMMReg[4] = auVar72._8_2_ + auVar77._8_2_ + auVar70._8_2_ + auVar73._8_2_;
  d->_w_ZMMReg[5] = auVar72._10_2_ + auVar77._10_2_ + auVar70._10_2_ + auVar73._10_2_;
  d->_w_ZMMReg[6] = auVar72._12_2_ + auVar77._12_2_ + auVar70._12_2_ + auVar73._12_2_;
  d->_w_ZMMReg[7] = auVar72._14_2_ + auVar77._14_2_ + auVar70._14_2_ + auVar73._14_2_;
  d->_q_ZMMReg[2] = local_30;
  d->_q_ZMMReg[3] = uStack_28;
  d->_q_ZMMReg[4] = local_20;
  d->_q_ZMMReg[5] = uStack_18;
  d->_q_ZMMReg[6] = local_10;
  d->_q_ZMMReg[7] = uStack_8;
  return;
}

Assistant:

void glue(helper_mpsadbw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  uint32_t offset)
{
    int s0 = (offset & 3) << 2;
    int d0 = (offset & 4) << 0;
    int i;
    Reg r;

    for (i = 0; i < 8; i++, d0++) {
        r.W(i) = 0;
        r.W(i) += abs1(d->B(d0 + 0) - s->B(s0 + 0));
        r.W(i) += abs1(d->B(d0 + 1) - s->B(s0 + 1));
        r.W(i) += abs1(d->B(d0 + 2) - s->B(s0 + 2));
        r.W(i) += abs1(d->B(d0 + 3) - s->B(s0 + 3));
    }

    *d = r;
}